

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

CopyStatus adios2sys::SystemTools::CopyFileContentBlockwise(string *source,string *destination)

{
  Status SVar1;
  WhichPath WVar2;
  CopyStatus CVar3;
  ofstream fout;
  ifstream fin;
  char buffer [4096];
  long local_1420;
  filebuf local_1418 [24];
  byte abStack_1400 [216];
  ios_base local_1328 [264];
  long local_1220;
  long local_1218;
  byte abStack_1200 [488];
  undefined1 local_1018 [4096];
  
  std::ifstream::ifstream(&local_1220,(source->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) != 0) {
    SVar1 = Status::POSIX_errno();
    WVar2 = SourcePath;
    goto LAB_00721755;
  }
  RemoveFile(destination);
  std::ofstream::ofstream(&local_1420,(destination->_M_dataplus)._M_p,_S_trunc|_S_out|_S_bin);
  if ((abStack_1400[*(long *)(local_1420 + -0x18)] & 5) == 0) {
    if ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) == 0) {
      do {
        std::istream::read((char *)&local_1220,(long)local_1018);
        if (local_1218 == 0) break;
        std::ostream::write((char *)&local_1420,(long)local_1018);
      } while ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) == 0);
    }
    std::ostream::flush();
    std::ifstream::close();
    std::ofstream::close();
    if ((abStack_1400[*(long *)(local_1420 + -0x18)] & 5) != 0) goto LAB_00721715;
    WVar2 = NoPath;
    SVar1.Kind_ = Success;
    SVar1.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  }
  else {
LAB_00721715:
    SVar1 = Status::POSIX_errno();
    WVar2 = DestPath;
  }
  local_1420 = _VTT;
  *(undefined8 *)(local_1418 + *(long *)(_VTT + -0x18) + -8) = _pthread_rwlock_init;
  std::filebuf::~filebuf(local_1418);
  std::ios_base::~ios_base(local_1328);
LAB_00721755:
  std::ifstream::~ifstream(&local_1220);
  CVar3.Path = WVar2;
  CVar3.super_Status = SVar1;
  return CVar3;
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileContentBlockwise(
  std::string const& source, std::string const& destination)
{
  // Open files
  kwsys::ifstream fin(source.c_str(), std::ios::in | std::ios::binary);
  if (!fin) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(destination);

  kwsys::ofstream fout(destination.c_str(),
                       std::ios::out | std::ios::trunc | std::ios::binary);
  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while (fin) {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      fout.write(buffer, fin.gcount());
    } else {
      break;
    }
  }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}